

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O3

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  long lVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  uint64_t uVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  secp256k1_gej *r_00;
  ulong *puVar118;
  ulong uVar119;
  int in_ECX;
  uint uVar120;
  long lVar121;
  ulong uVar122;
  ulong uVar123;
  int w;
  int w_00;
  uint uVar124;
  long lVar125;
  int iVar126;
  secp256k1_gej *r_01;
  ulong *puVar127;
  ulong uVar128;
  ulong *puVar129;
  secp256k1_gej *in_R8;
  ulong uVar130;
  ulong uVar131;
  bool bVar132;
  byte bVar133;
  uint64_t uVar134;
  uint64_t uVar142;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined4 uVar178;
  undefined1 auVar177 [16];
  ulong uVar179;
  ulong uVar184;
  undefined1 auVar180 [16];
  undefined4 uVar183;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  uint64_t tmp3_1;
  secp256k1_fe Z;
  secp256k1_scalar q_lam;
  secp256k1_scalar q_1;
  secp256k1_ge pre_a [8];
  secp256k1_ge pre_a_lam [8];
  int wnaf_1 [33];
  int wnaf_lam [33];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  ulong local_818;
  undefined1 auStack_810 [16];
  undefined1 local_800 [16];
  ulong local_7f0;
  int iStack_7e8;
  uint local_7e0;
  uint local_7dc;
  secp256k1_gej *local_7d8;
  uint64_t *local_7d0;
  secp256k1_fe *local_7c8;
  secp256k1_fe *local_7c0;
  undefined1 local_7b8 [32];
  ulong local_798;
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  ulong local_770;
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  ulong local_748;
  uint local_740;
  secp256k1_fe local_730;
  secp256k1_scalar local_708;
  secp256k1_scalar local_6e8;
  secp256k1_ge local_6c8;
  undefined1 auStack_670 [16];
  undefined1 auStack_660 [16];
  ulong uStack_650;
  undefined1 auStack_648 [16];
  undefined1 auStack_638 [16];
  ulong auStack_628 [68];
  secp256k1_ge local_408;
  undefined1 auStack_3b0 [16];
  undefined1 auStack_3a0 [16];
  ulong uStack_390;
  undefined1 auStack_388 [16];
  undefined1 auStack_378 [16];
  ulong auStack_368 [68];
  uint local_148 [32];
  uint local_c8;
  uint local_b8 [32];
  uint local_38;
  
  bVar133 = 0;
  if (a->infinity == 0) {
    secp256k1_scalar_split_lambda(&local_6e8,&local_708,scalar);
    local_7e0 = secp256k1_wnaf_const((int *)local_148,&local_6e8,w,in_ECX);
    local_7dc = secp256k1_wnaf_const((int *)local_b8,&local_708,w_00,in_ECX);
    r->infinity = a->infinity;
    (r->x).n[4] = (a->x).n[4];
    uVar134 = (a->x).n[0];
    uVar142 = (a->x).n[1];
    uVar115 = (a->x).n[3];
    (r->x).n[2] = (a->x).n[2];
    (r->x).n[3] = uVar115;
    (r->x).n[0] = uVar134;
    (r->x).n[1] = uVar142;
    local_7c8 = &r->y;
    uVar134 = (a->y).n[1];
    uVar142 = (a->y).n[2];
    uVar115 = (a->y).n[3];
    (r->y).n[0] = (a->y).n[0];
    (r->y).n[1] = uVar134;
    (r->y).n[2] = uVar142;
    (r->y).n[3] = uVar115;
    (r->y).n[4] = (a->y).n[4];
    local_7c0 = &r->z;
    (r->z).n[0] = 1;
    local_7d0 = (r->z).n + 1;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    local_7d8 = r;
    secp256k1_ecmult_odd_multiples_table((int)&local_6c8,&local_408,&local_730,&r->x,in_R8);
    secp256k1_ge_table_set_globalz(8,&local_6c8,&local_408.x);
    lVar125 = 0x28;
    do {
      secp256k1_fe_impl_normalize_weak((secp256k1_fe *)((long)local_6c8.x.n + lVar125));
      r_01 = local_7d8;
      lVar125 = lVar125 + 0x58;
    } while (lVar125 != 0x2e8);
    lVar125 = 0;
    do {
      puVar118 = (ulong *)((long)local_408.x.n + lVar125);
      puVar127 = (ulong *)((long)local_6c8.x.n + lVar125);
      puVar129 = puVar118;
      for (lVar121 = 0xb; lVar121 != 0; lVar121 = lVar121 + -1) {
        *puVar129 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar133 * -2 + 1;
        puVar129 = puVar129 + (ulong)bVar133 * -2 + 1;
      }
      uVar123 = *puVar118;
      uVar131 = *(ulong *)((long)local_408.x.n + lVar125 + 8);
      uVar179 = *(ulong *)((long)local_408.x.n + lVar125 + 0x10);
      uVar184 = *(ulong *)((long)local_408.x.n + lVar125 + 0x18);
      uVar1 = *(ulong *)((long)local_408.x.n + lVar125 + 0x20);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar184;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar179;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar131;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar123;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar1;
      uVar119 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar40,0);
      auVar159._8_8_ = 0;
      auVar159._0_8_ = uVar119 & 0xfffffffffffff;
      auVar159 = ZEXT816(0x7512f58995c13) * auVar37 + ZEXT816(0x96c28719501ee) * auVar36 +
                 ZEXT816(0xc3434e99cf049) * auVar38 + ZEXT816(0x7106e64479ea) * auVar39 +
                 auVar159 * ZEXT816(0x1000003d10);
      uVar122 = auVar159._0_8_;
      uVar128 = uVar122 & 0xfffffffffffff;
      local_7b8._4_4_ = (undefined4)(uVar128 >> 0x20);
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar122 >> 0x34 | auVar159._8_8_ << 0xc;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar1;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar184;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar179;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar131;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar123;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar119 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar40,8) << 0xc;
      auVar159 = ZEXT816(0x96c28719501ee) * auVar41 + auVar100 + ZEXT816(0x7512f58995c13) * auVar42
                 + ZEXT816(0xc3434e99cf049) * auVar43 + ZEXT816(0x7106e64479ea) * auVar44 +
                 ZEXT816(0x7ae96a2b657c) * auVar45 + auVar2 * ZEXT816(0x1000003d10);
      uVar119 = auVar159._0_8_;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar119 >> 0x34 | auVar159._8_8_ << 0xc;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar123;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar1;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar184;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar179;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar131;
      auVar159 = ZEXT816(0x7512f58995c13) * auVar47 + auVar101 + ZEXT816(0xc3434e99cf049) * auVar48
                 + ZEXT816(0x7106e64479ea) * auVar49 + ZEXT816(0x7ae96a2b657c) * auVar50;
      uVar122 = auVar159._0_8_;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar122 >> 0x34 | auVar159._8_8_ << 0xc;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = (uVar122 & 0xfffffffffffff) << 4 | (uVar119 & 0xfffffffffffff) >> 0x30;
      uVar122 = auVar148._0_8_;
      auVar148 = ZEXT816(0x96c28719501ee) * auVar46 + ZEXT816(0x1000003d1) * auVar51;
      *puVar118 = uVar122 & 0xfffffffffffff;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar122 >> 0x34 | auVar148._8_8_ << 0xc;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar131;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar123;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar1;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar184;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar179;
      auVar2 = ZEXT816(0xc3434e99cf049) * auVar54 + auVar103 + ZEXT816(0x7106e64479ea) * auVar55 +
               ZEXT816(0x7ae96a2b657c) * auVar56;
      uVar122 = auVar2._0_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar122 & 0xfffffffffffff;
      auVar159 = ZEXT816(0x96c28719501ee) * auVar52 + auVar102 + ZEXT816(0x7512f58995c13) * auVar53
                 + auVar3 * ZEXT816(0x1000003d10);
      uVar130 = auVar159._0_8_;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar122 >> 0x34 | auVar2._8_8_ << 0xc;
      *(ulong *)((long)local_408.x.n + lVar125 + 8) = uVar130 & 0xfffffffffffff;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar130 >> 0x34 | auVar159._8_8_ << 0xc;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar179;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar131;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar123;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar1;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar184;
      auVar2 = ZEXT816(0x7106e64479ea) * auVar60 + auVar105 + ZEXT816(0x7ae96a2b657c) * auVar61;
      uVar123 = auVar2._0_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar123 & 0xfffffffffffff;
      auVar159 = ZEXT816(0x96c28719501ee) * auVar57 + auVar104 + ZEXT816(0x7512f58995c13) * auVar58
                 + ZEXT816(0xc3434e99cf049) * auVar59 + auVar4 * ZEXT816(0x1000003d10);
      uVar131 = auVar159._0_8_;
      *(ulong *)((long)local_408.x.n + lVar125 + 0x10) = uVar131 & 0xfffffffffffff;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = (uVar131 >> 0x34 | auVar159._8_8_ << 0xc) + uVar128;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar123 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar106 = auVar5 * ZEXT816(0x1000003d10) + auVar106;
      uVar123 = auVar106._0_8_;
      *(ulong *)((long)local_408.x.n + lVar125 + 0x18) = uVar123 & 0xfffffffffffff;
      *(ulong *)((long)local_408.x.n + lVar125 + 0x20) =
           (uVar123 >> 0x34 | auVar106._8_8_ << 0xc) + (uVar119 & 0xffffffffffff);
      lVar125 = lVar125 + 0x58;
    } while (lVar125 != 0x2c0);
    uVar124 = ((int)local_c8 >> 0x1f) + local_c8 ^ (int)local_c8 >> 0x1f;
    local_838._8_8_ = local_6c8.x.n[1];
    local_838._0_8_ = local_6c8.x.n[0];
    local_828._8_8_ = local_6c8.x.n[3];
    local_828._0_8_ = local_6c8.x.n[2];
    auStack_810._8_8_ = local_6c8.y.n[1];
    auStack_810._0_8_ = local_6c8.y.n[0];
    local_800._8_8_ = local_6c8.y.n[3];
    local_800._0_8_ = local_6c8.y.n[2];
    lVar125 = 0;
    auVar148._8_4_ = 0xffffffff;
    auVar148._0_8_ = 0xffffffffffffffff;
    auVar148._12_4_ = 0xffffffff;
    uVar134 = local_6c8.y.n[4];
    uVar142 = local_6c8.x.n[4];
    do {
      bVar132 = (ulong)(uint)((int)uVar124 >> 1) * 0x58 + -0x58 == lVar125;
      uVar184 = (ulong)bVar132;
      uVar179 = (ulong)bVar132;
      uVar123 = -uVar179;
      uVar131 = -uVar184;
      uVar179 = uVar179 - 1;
      uVar184 = uVar184 + auVar148._8_8_;
      uVar183 = (undefined4)(uVar184 >> 0x20);
      auVar88._8_4_ = (int)uVar184;
      auVar88._0_8_ = uVar184;
      auVar88._12_4_ = uVar183;
      uVar178 = (undefined4)(uVar131 >> 0x20);
      auVar96._8_4_ = (int)uVar131;
      auVar96._0_8_ = uVar131;
      auVar96._12_4_ = uVar178;
      local_838 = *(undefined1 (*) [16])(auStack_670 + lVar125) & auVar96 | local_838 & auVar88;
      auVar89._8_4_ = (int)uVar184;
      auVar89._0_8_ = uVar184;
      auVar89._12_4_ = uVar183;
      auVar97._8_4_ = (int)uVar131;
      auVar97._0_8_ = uVar131;
      auVar97._12_4_ = uVar178;
      local_828 = *(undefined1 (*) [16])(auStack_660 + lVar125) & auVar97 | local_828 & auVar89;
      uVar134 = *(ulong *)((long)auStack_628 + lVar125) & uVar123 | uVar134 & uVar179;
      uVar142 = *(ulong *)((long)&uStack_650 + lVar125) & uVar131 | uVar142 & uVar184;
      auVar171._8_4_ = (int)uVar179;
      auVar171._0_8_ = uVar179;
      auVar171._12_4_ = (int)(uVar179 >> 0x20);
      auVar175._8_4_ = (int)uVar123;
      auVar175._0_8_ = uVar123;
      auVar175._12_4_ = (int)(uVar123 >> 0x20);
      auStack_810 = *(undefined1 (*) [16])(auStack_648 + lVar125) & auVar175 |
                    auStack_810 & auVar171;
      local_800 = *(undefined1 (*) [16])(auStack_638 + lVar125) & auVar175 | local_800 & auVar171;
      lVar125 = lVar125 + 0x58;
    } while (lVar125 != 0x268);
    lVar125 = 0;
    auVar147._0_8_ = 0x3ffffbfffff0bc - auStack_810._0_8_;
    auVar147._8_8_ = 0x3ffffffffffffc - auStack_810._8_8_;
    auVar158._0_8_ = 0x3ffffffffffffc - local_800._0_8_;
    auVar158._8_8_ = 0x3ffffffffffffc - local_800._8_8_;
    lVar121 = (long)(int)(uint)(local_c8 != uVar124);
    uVar123 = lVar121 - 1;
    uVar131 = -lVar121;
    auVar135._8_4_ = (int)uVar123;
    auVar135._0_8_ = uVar123;
    auVar135._12_4_ = (int)(uVar123 >> 0x20);
    auVar165._8_4_ = (int)uVar131;
    auVar165._0_8_ = uVar131;
    auVar165._12_4_ = (int)(uVar131 >> 0x20);
    auVar148 = auVar147 & auVar165 | auStack_810 & auVar135;
    auVar159 = auVar158 & auVar165 | auVar135 & local_800;
    local_7d8->infinity = 0;
    (local_7d8->x).n[4] = uVar142;
    (local_7d8->x).n[2] = local_828._0_8_;
    (local_7d8->x).n[3] = local_828._8_8_;
    (local_7d8->x).n[0] = local_838._0_8_;
    (local_7d8->x).n[1] = local_838._8_8_;
    auStack_810._0_8_ = auVar148._0_8_;
    auStack_810._8_8_ = auVar148._8_8_;
    local_800._0_8_ = auVar159._0_8_;
    local_800._8_8_ = auVar159._8_8_;
    local_7c8->n[2] = local_800._0_8_;
    local_7c8->n[3] = local_800._8_8_;
    local_7c8->n[4] = uVar131 & 0x3fffffffffffc - uVar134 | uVar123 & uVar134;
    local_7c8->n[0] = auStack_810._0_8_;
    local_7c8->n[1] = auStack_810._8_8_;
    (local_7d8->z).n[0] = 1;
    local_7d0[2] = 0;
    local_7d0[3] = 0;
    *local_7d0 = 0;
    local_7d0[1] = 0;
    uVar124 = ((int)local_38 >> 0x1f) + local_38 ^ (int)local_38 >> 0x1f;
    local_838._8_8_ = local_408.x.n[1];
    local_838._0_8_ = local_408.x.n[0];
    local_828._8_8_ = local_408.x.n[3];
    local_828._0_8_ = local_408.x.n[2];
    local_800._8_8_ = local_408.y.n[3];
    local_800._0_8_ = local_408.y.n[2];
    auStack_810._8_8_ = local_408.y.n[1];
    auStack_810._0_8_ = local_408.y.n[0];
    auVar150._8_8_ = local_408.y.n[4];
    auVar150._0_8_ = local_408.x.n[4];
    auVar143._8_4_ = 0xffffffff;
    auVar143._0_8_ = 0xffffffffffffffff;
    auVar143._12_4_ = 0xffffffff;
    do {
      bVar132 = (ulong)(uint)((int)uVar124 >> 1) * 0x58 + -0x58 == lVar125;
      uVar131 = (ulong)bVar132;
      uVar123 = (ulong)bVar132;
      lVar121 = -uVar123;
      lVar107 = -uVar131;
      auVar180._8_8_ = lVar107;
      auVar180._0_8_ = lVar121;
      auVar177._0_8_ = uVar123 - 1;
      auVar177._8_8_ = uVar131 + auVar143._8_8_;
      uVar178 = (undefined4)((ulong)auVar177._0_8_ >> 0x20);
      auVar90._8_4_ = (int)auVar177._0_8_;
      auVar90._0_8_ = auVar177._0_8_;
      auVar90._12_4_ = uVar178;
      uVar183 = (undefined4)((ulong)lVar121 >> 0x20);
      auVar98._8_4_ = (int)lVar121;
      auVar98._0_8_ = lVar121;
      auVar98._12_4_ = uVar183;
      local_838 = *(undefined1 (*) [16])(auStack_3b0 + lVar125) & auVar98 | local_838 & auVar90;
      auVar91._8_4_ = (int)auVar177._0_8_;
      auVar91._0_8_ = auVar177._0_8_;
      auVar91._12_4_ = uVar178;
      auVar99._8_4_ = (int)lVar121;
      auVar99._0_8_ = lVar121;
      auVar99._12_4_ = uVar183;
      local_828 = *(undefined1 (*) [16])(auStack_3a0 + lVar125) & auVar99 | local_828 & auVar91;
      auVar149._8_8_ = *(undefined8 *)((long)auStack_368 + lVar125);
      auVar149._0_8_ = *(undefined8 *)((long)&uStack_390 + lVar125);
      auVar150 = auVar149 & auVar180 | auVar150 & auVar177;
      auVar172._8_4_ = (int)auVar177._8_8_;
      auVar172._0_8_ = auVar177._8_8_;
      auVar172._12_4_ = (int)((ulong)auVar177._8_8_ >> 0x20);
      auVar176._8_4_ = (int)lVar107;
      auVar176._0_8_ = lVar107;
      auVar176._12_4_ = (int)((ulong)lVar107 >> 0x20);
      auStack_810 = *(undefined1 (*) [16])(auStack_388 + lVar125) & auVar176 |
                    auStack_810 & auVar172;
      local_800 = *(undefined1 (*) [16])(auStack_378 + lVar125) & auVar176 | local_800 & auVar172;
      lVar125 = lVar125 + 0x58;
    } while (lVar125 != 0x268);
    local_818 = auVar150._0_8_;
    iStack_7e8 = 0;
    auVar160._0_8_ = 0x3ffffbfffff0bc - auStack_810._0_8_;
    auVar160._8_8_ = 0x3ffffffffffffc - auStack_810._8_8_;
    auVar144._0_8_ = 0x3ffffffffffffc - local_800._0_8_;
    auVar144._8_8_ = 0x3ffffffffffffc - local_800._8_8_;
    local_7b8._0_4_ = ZEXT14(local_38 != uVar124);
    uVar123 = (long)(int)local_7b8._0_4_ - 1;
    uVar131 = -(long)(int)local_7b8._0_4_;
    auVar151._8_4_ = (int)uVar123;
    auVar151._0_8_ = uVar123;
    auVar151._12_4_ = (int)(uVar123 >> 0x20);
    auVar166._8_4_ = (int)uVar131;
    auVar166._0_8_ = uVar131;
    auVar166._12_4_ = (int)(uVar131 >> 0x20);
    auStack_810 = auVar160 & auVar166 | auStack_810 & auVar151;
    local_800 = auVar144 & auVar166 | auVar151 & local_800;
    local_7f0 = uVar131 & 0x3fffffffffffc - auVar150._8_8_ | uVar123 & auVar150._8_8_;
    secp256k1_gej_add_ge(local_7d8,local_7d8,(secp256k1_ge *)local_838);
    lVar125 = 0x1f;
    do {
      iVar126 = 4;
      do {
        secp256k1_gej_double(r_01,r_01);
        r_00 = local_7d8;
        iVar126 = iVar126 + -1;
      } while (iVar126 != 0);
      uVar124 = local_148[lVar125];
      uVar120 = ((int)uVar124 >> 0x1f) + uVar124 ^ (int)uVar124 >> 0x1f;
      local_828._8_8_ = local_6c8.x.n[3];
      local_828._0_8_ = local_6c8.x.n[2];
      local_838._8_8_ = local_6c8.x.n[1];
      local_838._0_8_ = local_6c8.x.n[0];
      local_800._8_8_ = local_6c8.y.n[3];
      local_800._0_8_ = local_6c8.y.n[2];
      auStack_810._8_8_ = local_6c8.y.n[1];
      auStack_810._0_8_ = local_6c8.y.n[0];
      lVar121 = 0;
      local_818 = local_6c8.x.n[4];
      uVar134 = local_6c8.y.n[4];
      do {
        bVar132 = (ulong)(uint)((int)uVar120 >> 1) * 0x58 + -0x58 == lVar121;
        uVar184 = (ulong)bVar132;
        uVar179 = (ulong)bVar132;
        uVar123 = -uVar179;
        uVar131 = -uVar184;
        uVar179 = uVar179 - 1;
        uVar184 = uVar184 - 1;
        auVar181._8_4_ = (int)uVar179;
        auVar181._0_8_ = uVar179;
        auVar181._12_4_ = (int)(uVar179 >> 0x20);
        uVar178 = (undefined4)(uVar123 >> 0x20);
        auVar92._8_4_ = (int)uVar123;
        auVar92._0_8_ = uVar123;
        auVar92._12_4_ = uVar178;
        local_838 = *(undefined1 (*) [16])(auStack_670 + lVar121) & auVar92 | local_838 & auVar181;
        auVar93._8_4_ = (int)uVar123;
        auVar93._0_8_ = uVar123;
        auVar93._12_4_ = uVar178;
        local_828 = *(undefined1 (*) [16])(auStack_660 + lVar121) & auVar93 | local_828 & auVar181;
        local_818 = *(ulong *)((long)&uStack_650 + lVar121) & uVar123 | local_818 & uVar179;
        uVar134 = *(ulong *)((long)auStack_628 + lVar121) & uVar131 | uVar134 & uVar184;
        auVar167._8_4_ = (int)uVar184;
        auVar167._0_8_ = uVar184;
        auVar167._12_4_ = (int)(uVar184 >> 0x20);
        auVar173._8_4_ = (int)uVar131;
        auVar173._0_8_ = uVar131;
        auVar173._12_4_ = (int)(uVar131 >> 0x20);
        auStack_810 = *(undefined1 (*) [16])(auStack_648 + lVar121) & auVar173 |
                      auStack_810 & auVar167;
        local_800 = *(undefined1 (*) [16])(auStack_638 + lVar121) & auVar173 | local_800 & auVar167;
        lVar121 = lVar121 + 0x58;
      } while (lVar121 != 0x268);
      iStack_7e8 = 0;
      auVar161._0_8_ = 0x3ffffbfffff0bc - auStack_810._0_8_;
      auVar161._8_8_ = 0x3ffffffffffffc - auStack_810._8_8_;
      auVar152._0_8_ = 0x3ffffffffffffc - local_800._0_8_;
      auVar152._8_8_ = 0x3ffffffffffffc - local_800._8_8_;
      local_7b8._0_4_ = ZEXT14(uVar124 != uVar120);
      uVar123 = (long)(int)local_7b8._0_4_ - 1;
      uVar131 = -(long)(int)local_7b8._0_4_;
      auVar145._8_4_ = (int)uVar123;
      auVar145._0_8_ = uVar123;
      auVar145._12_4_ = (int)(uVar123 >> 0x20);
      auVar168._8_4_ = (int)uVar131;
      auVar168._0_8_ = uVar131;
      auVar168._12_4_ = (int)(uVar131 >> 0x20);
      auStack_810 = auVar161 & auVar168 | auStack_810 & auVar145;
      local_800 = auVar152 & auVar168 | auVar145 & local_800;
      local_7f0 = uVar131 & 0x3fffffffffffc - uVar134 | uVar123 & uVar134;
      secp256k1_gej_add_ge(local_7d8,local_7d8,(secp256k1_ge *)local_838);
      uVar124 = local_b8[lVar125];
      uVar120 = ((int)uVar124 >> 0x1f) + uVar124 ^ (int)uVar124 >> 0x1f;
      local_828._8_8_ = local_408.x.n[3];
      local_828._0_8_ = local_408.x.n[2];
      local_838._8_8_ = local_408.x.n[1];
      local_838._0_8_ = local_408.x.n[0];
      local_800._8_8_ = local_408.y.n[3];
      local_800._0_8_ = local_408.y.n[2];
      auStack_810._8_8_ = local_408.y.n[1];
      auStack_810._0_8_ = local_408.y.n[0];
      lVar121 = 0;
      local_818 = local_408.x.n[4];
      uVar134 = local_408.y.n[4];
      do {
        bVar132 = (ulong)(uint)((int)uVar120 >> 1) * 0x58 + -0x58 == lVar121;
        uVar184 = (ulong)bVar132;
        uVar179 = (ulong)bVar132;
        uVar123 = -uVar179;
        uVar131 = -uVar184;
        uVar179 = uVar179 - 1;
        uVar184 = uVar184 - 1;
        auVar182._8_4_ = (int)uVar179;
        auVar182._0_8_ = uVar179;
        auVar182._12_4_ = (int)(uVar179 >> 0x20);
        uVar178 = (undefined4)(uVar123 >> 0x20);
        auVar94._8_4_ = (int)uVar123;
        auVar94._0_8_ = uVar123;
        auVar94._12_4_ = uVar178;
        local_838 = *(undefined1 (*) [16])(auStack_3b0 + lVar121) & auVar94 | local_838 & auVar182;
        auVar95._8_4_ = (int)uVar123;
        auVar95._0_8_ = uVar123;
        auVar95._12_4_ = uVar178;
        local_828 = *(undefined1 (*) [16])(auStack_3a0 + lVar121) & auVar95 | local_828 & auVar182;
        local_818 = *(ulong *)((long)&uStack_390 + lVar121) & uVar123 | local_818 & uVar179;
        uVar134 = *(ulong *)((long)auStack_368 + lVar121) & uVar131 | uVar134 & uVar184;
        auVar169._8_4_ = (int)uVar184;
        auVar169._0_8_ = uVar184;
        auVar169._12_4_ = (int)(uVar184 >> 0x20);
        auVar174._8_4_ = (int)uVar131;
        auVar174._0_8_ = uVar131;
        auVar174._12_4_ = (int)(uVar131 >> 0x20);
        auStack_810 = *(undefined1 (*) [16])(auStack_388 + lVar121) & auVar174 |
                      auStack_810 & auVar169;
        local_800 = *(undefined1 (*) [16])(auStack_378 + lVar121) & auVar174 | local_800 & auVar169;
        lVar121 = lVar121 + 0x58;
      } while (lVar121 != 0x268);
      iStack_7e8 = 0;
      auVar162._0_8_ = 0x3ffffbfffff0bc - auStack_810._0_8_;
      auVar162._8_8_ = 0x3ffffffffffffc - auStack_810._8_8_;
      auVar153._0_8_ = 0x3ffffffffffffc - local_800._0_8_;
      auVar153._8_8_ = 0x3ffffffffffffc - local_800._8_8_;
      local_7b8._0_4_ = ZEXT14(uVar124 != uVar120);
      uVar123 = (long)(int)local_7b8._0_4_ - 1;
      uVar131 = -(long)(int)local_7b8._0_4_;
      auVar146._8_4_ = (int)uVar123;
      auVar146._0_8_ = uVar123;
      auVar146._12_4_ = (int)(uVar123 >> 0x20);
      auVar170._8_4_ = (int)uVar131;
      auVar170._0_8_ = uVar131;
      auVar170._12_4_ = (int)(uVar131 >> 0x20);
      auStack_810 = auVar162 & auVar170 | auStack_810 & auVar146;
      local_800 = auVar153 & auVar170 | auVar146 & local_800;
      local_7f0 = uVar131 & 0x3fffffffffffc - uVar134 | uVar123 & uVar134;
      secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)local_838);
      bVar132 = lVar125 != 0;
      lVar125 = lVar125 + -1;
      r_01 = r_00;
    } while (bVar132);
    secp256k1_ge_neg((secp256k1_ge *)local_838,&local_6c8);
    secp256k1_gej_add_ge((secp256k1_gej *)local_7b8,r_00,(secp256k1_ge *)local_838);
    uVar123 = (long)(int)local_7e0 - 1;
    uVar131 = -(long)(int)local_7e0;
    auVar136._8_4_ = (int)uVar123;
    auVar136._0_8_ = uVar123;
    auVar136._12_4_ = (int)(uVar123 >> 0x20);
    auVar148 = *(undefined1 (*) [16])((r_00->x).n + 2);
    auVar154._8_4_ = (int)uVar131;
    auVar154._0_8_ = uVar131;
    auVar154._12_4_ = (int)(uVar131 >> 0x20);
    auVar116._4_4_ = local_7b8._4_4_;
    auVar116._0_4_ = local_7b8._0_4_;
    auVar116._8_8_ = local_7b8._8_8_;
    *(undefined1 (*) [16])(r_00->x).n =
         auVar116 & auVar154 | *(undefined1 (*) [16])(r_00->x).n & auVar136;
    *(undefined1 (*) [16])((r_00->x).n + 2) = auVar154 & local_7b8._16_16_ | auVar148 & auVar136;
    (r_00->x).n[4] = uVar131 & local_798 | uVar123 & (r_00->x).n[4];
    uVar123 = (long)(int)local_7e0 - 1;
    uVar131 = -(long)(int)local_7e0;
    auVar137._8_4_ = (int)uVar123;
    auVar137._0_8_ = uVar123;
    auVar137._12_4_ = (int)(uVar123 >> 0x20);
    auVar148 = *(undefined1 (*) [16])((r_00->y).n + 2);
    auVar163._8_4_ = (int)uVar131;
    auVar163._0_8_ = uVar131;
    auVar163._12_4_ = (int)(uVar131 >> 0x20);
    *(undefined1 (*) [16])(r_00->y).n =
         local_790 & auVar163 | *(undefined1 (*) [16])(r_00->y).n & auVar137;
    *(undefined1 (*) [16])((r_00->y).n + 2) = local_780 & auVar163 | auVar148 & auVar137;
    (r_00->y).n[4] = uVar131 & local_770 | uVar123 & (r_00->y).n[4];
    uVar123 = (long)(int)local_7e0 - 1;
    uVar131 = -(long)(int)local_7e0;
    auVar138._8_4_ = (int)uVar123;
    auVar138._0_8_ = uVar123;
    auVar138._12_4_ = (int)(uVar123 >> 0x20);
    auVar148 = *(undefined1 (*) [16])((r_00->z).n + 2);
    auVar155._8_4_ = (int)uVar131;
    auVar155._0_8_ = uVar131;
    auVar155._12_4_ = (int)(uVar131 >> 0x20);
    *(undefined1 (*) [16])(r_00->z).n =
         local_768 & auVar155 | *(undefined1 (*) [16])(r_00->z).n & auVar138;
    *(undefined1 (*) [16])((r_00->z).n + 2) = auVar155 & local_758 | auVar148 & auVar138;
    (r_00->z).n[4] = uVar131 & local_748 | uVar123 & (r_00->z).n[4];
    r_00->infinity = (local_740 ^ r_00->infinity) & local_7e0 ^ r_00->infinity;
    secp256k1_ge_neg((secp256k1_ge *)local_838,&local_408);
    secp256k1_gej_add_ge((secp256k1_gej *)local_7b8,r_00,(secp256k1_ge *)local_838);
    uVar123 = (long)(int)local_7dc - 1;
    uVar131 = -(long)(int)local_7dc;
    auVar139._8_4_ = (int)uVar123;
    auVar139._0_8_ = uVar123;
    auVar139._12_4_ = (int)(uVar123 >> 0x20);
    auVar148 = *(undefined1 (*) [16])((r_00->x).n + 2);
    auVar156._8_4_ = (int)uVar131;
    auVar156._0_8_ = uVar131;
    auVar156._12_4_ = (int)(uVar131 >> 0x20);
    auVar117._4_4_ = local_7b8._4_4_;
    auVar117._0_4_ = local_7b8._0_4_;
    auVar117._8_8_ = local_7b8._8_8_;
    *(undefined1 (*) [16])(r_00->x).n =
         auVar117 & auVar156 | *(undefined1 (*) [16])(r_00->x).n & auVar139;
    *(undefined1 (*) [16])((r_00->x).n + 2) = auVar156 & local_7b8._16_16_ | auVar148 & auVar139;
    (r_00->x).n[4] = uVar131 & local_798 | uVar123 & (r_00->x).n[4];
    uVar123 = (long)(int)local_7dc - 1;
    uVar131 = -(long)(int)local_7dc;
    auVar140._8_4_ = (int)uVar123;
    auVar140._0_8_ = uVar123;
    auVar140._12_4_ = (int)(uVar123 >> 0x20);
    auVar148 = *(undefined1 (*) [16])((r_00->y).n + 2);
    auVar164._8_4_ = (int)uVar131;
    auVar164._0_8_ = uVar131;
    auVar164._12_4_ = (int)(uVar131 >> 0x20);
    *(undefined1 (*) [16])(r_00->y).n =
         local_790 & auVar164 | *(undefined1 (*) [16])(r_00->y).n & auVar140;
    *(undefined1 (*) [16])((r_00->y).n + 2) = local_780 & auVar164 | auVar148 & auVar140;
    (r_00->y).n[4] = uVar131 & local_770 | uVar123 & (r_00->y).n[4];
    uVar123 = (long)(int)local_7dc - 1;
    uVar131 = -(long)(int)local_7dc;
    auVar141._8_4_ = (int)uVar123;
    auVar141._0_8_ = uVar123;
    auVar141._12_4_ = (int)(uVar123 >> 0x20);
    auVar148 = *(undefined1 (*) [16])((r_00->z).n + 2);
    auVar157._8_4_ = (int)uVar131;
    auVar157._0_8_ = uVar131;
    auVar157._12_4_ = (int)(uVar131 >> 0x20);
    *(undefined1 (*) [16])(r_00->z).n =
         local_768 & auVar157 | *(undefined1 (*) [16])(r_00->z).n & auVar141;
    *(undefined1 (*) [16])((r_00->z).n + 2) = auVar157 & local_758 | auVar148 & auVar141;
    (r_00->z).n[4] = uVar131 & local_748 | uVar123 & (r_00->z).n[4];
    r_00->infinity = (local_740 ^ r_00->infinity) & local_7dc ^ r_00->infinity;
    uVar123 = local_7c0->n[0];
    uVar131 = local_7c0->n[1];
    uVar179 = local_7c0->n[2];
    uVar184 = local_7c0->n[3];
    uVar1 = local_7c0->n[4];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_730.n[0];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar184;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_730.n[1];
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar179;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_730.n[2];
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar131;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_730.n[3];
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar123;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_730.n[4];
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar1;
    uVar119 = SUB168(auVar10 * auVar66,0);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar119 & 0xfffffffffffff;
    auVar148 = auVar7 * auVar63 + auVar6 * auVar62 + auVar8 * auVar64 + auVar9 * auVar65 +
               auVar11 * ZEXT816(0x1000003d10);
    uVar122 = auVar148._0_8_;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar122 >> 0x34 | auVar148._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_730.n[0];
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar1;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_730.n[1];
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar184;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_730.n[2];
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar179;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_730.n[3];
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar131;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_730.n[4];
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar123;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar119 >> 0x34 | SUB168(auVar10 * auVar66,8) << 0xc;
    auVar148 = auVar12 * auVar67 + auVar108 + auVar13 * auVar68 + auVar14 * auVar69 +
               auVar15 * auVar70 + auVar16 * auVar71 + auVar17 * ZEXT816(0x1000003d10);
    uVar119 = auVar148._0_8_;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar119 >> 0x34 | auVar148._8_8_ << 0xc;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_730.n[0];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar123;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_730.n[1];
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar1;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_730.n[2];
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar184;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_730.n[3];
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar179;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_730.n[4];
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar131;
    auVar148 = auVar19 * auVar73 + auVar109 + auVar20 * auVar74 + auVar21 * auVar75 +
               auVar22 * auVar76;
    uVar128 = auVar148._0_8_;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar128 >> 0x34 | auVar148._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = (uVar128 & 0xfffffffffffff) << 4 | (uVar119 & 0xfffffffffffff) >> 0x30;
    auVar148 = auVar18 * auVar72 + ZEXT816(0x1000003d1) * auVar77;
    uVar128 = auVar148._0_8_;
    local_7c0->n[0] = uVar128 & 0xfffffffffffff;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar128 >> 0x34 | auVar148._8_8_ << 0xc;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_730.n[0];
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar131;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_730.n[1];
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar123;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_730.n[2];
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar1;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_730.n[3];
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar184;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_730.n[4];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar179;
    auVar159 = auVar25 * auVar80 + auVar111 + auVar26 * auVar81 + auVar27 * auVar82;
    uVar128 = auVar159._0_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar128 & 0xfffffffffffff;
    auVar148 = auVar23 * auVar78 + auVar110 + auVar24 * auVar79 + auVar28 * ZEXT816(0x1000003d10);
    uVar130 = auVar148._0_8_;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar128 >> 0x34 | auVar159._8_8_ << 0xc;
    local_7c0->n[1] = uVar130 & 0xfffffffffffff;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar130 >> 0x34 | auVar148._8_8_ << 0xc;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_730.n[0];
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar179;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_730.n[1];
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar131;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_730.n[2];
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar123;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_730.n[3];
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar1;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_730.n[4];
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar184;
    auVar159 = auVar32 * auVar86 + auVar113 + auVar33 * auVar87;
    uVar123 = auVar159._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar123 & 0xfffffffffffff;
    auVar148 = auVar29 * auVar83 + auVar112 + auVar30 * auVar84 + auVar31 * auVar85 +
               auVar34 * ZEXT816(0x1000003d10);
    uVar131 = auVar148._0_8_;
    local_7c0->n[2] = uVar131 & 0xfffffffffffff;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = (uVar131 >> 0x34 | auVar148._8_8_ << 0xc) + (uVar122 & 0xfffffffffffff);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar123 >> 0x34 | auVar159._8_8_ << 0xc;
    auVar114 = auVar35 * ZEXT816(0x1000003d10) + auVar114;
    uVar123 = auVar114._0_8_;
    local_7c0->n[3] = uVar123 & 0xfffffffffffff;
    local_7c0->n[4] = (uVar123 >> 0x34 | auVar114._8_8_ << 0xc) + (uVar119 & 0xffffffffffff);
  }
  else {
    r->infinity = 1;
    (r->x).n[0] = 0;
    (r->x).n[1] = 0;
    (r->x).n[2] = 0;
    (r->x).n[3] = 0;
    *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
    (r->y).n[1] = 0;
    (r->y).n[2] = 0;
    (r->y).n[3] = 0;
    (r->y).n[4] = 0;
    (r->z).n[0] = 0;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;

    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* build wnaf representation for q. */
    /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
    secp256k1_scalar_split_lambda(&q_1, &q_lam, scalar);
    skew_1   = secp256k1_wnaf_const(wnaf_1,   &q_1,   WINDOW_A - 1, 128);
    skew_lam = secp256k1_wnaf_const(wnaf_lam, &q_lam, WINDOW_A - 1, 128);

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    VERIFY_CHECK(!a->infinity);
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(128, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
    i = wnaf_lam[WNAF_SIZE_BITS(128, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
    secp256k1_gej_add_ge(r, r, &tmpa);
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(128, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double(r, r);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
        n = wnaf_lam[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }

    {
        /* Correct for wNAF skew */
        secp256k1_gej tmpj;

        secp256k1_ge_neg(&tmpa, &pre_a[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_1);

        secp256k1_ge_neg(&tmpa, &pre_a_lam[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_lam);
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);
}